

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::DataPageHeaderV2::printTo(DataPageHeaderV2 *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _DataPageHeaderV2__isset _Var2;
  type *val;
  string local_68;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"DataPageHeaderV2(",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"num_values=",0xb);
  duckdb_apache::thrift::to_string<int>(&local_68,&this->num_values);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_68._M_dataplus._M_p,local_68._M_string_length);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"num_nulls=",10);
  duckdb_apache::thrift::to_string<int>(&local_68,&this->num_nulls);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"num_rows=",9);
  duckdb_apache::thrift::to_string<int>(&local_68,&this->num_rows);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"encoding=",9);
  to_string_abi_cxx11_(&local_68,(duckdb_parquet *)&this->encoding,val);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"definition_levels_byte_length=",0x1e);
  duckdb_apache::thrift::to_string<int>(&local_68,&this->definition_levels_byte_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"repetition_levels_byte_length=",0x1e);
  duckdb_apache::thrift::to_string<int>(&local_68,&this->repetition_levels_byte_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"is_compressed=",0xe);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<bool>(&local_68,&this->is_compressed);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,local_68._M_dataplus._M_p,local_68._M_string_length);
  }
  if ((((byte)_Var2 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1)) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"statistics=",0xb);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::Statistics>(&local_48,&this->statistics);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,local_48._M_dataplus._M_p,local_48._M_string_length);
  }
  if ((((byte)_Var2 & 2) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,")",1);
  return;
}

Assistant:

void DataPageHeaderV2::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "DataPageHeaderV2(";
  out << "num_values=" << to_string(num_values);
  out << ", " << "num_nulls=" << to_string(num_nulls);
  out << ", " << "num_rows=" << to_string(num_rows);
  out << ", " << "encoding=" << to_string(encoding);
  out << ", " << "definition_levels_byte_length=" << to_string(definition_levels_byte_length);
  out << ", " << "repetition_levels_byte_length=" << to_string(repetition_levels_byte_length);
  out << ", " << "is_compressed="; (__isset.is_compressed ? (out << to_string(is_compressed)) : (out << "<null>"));
  out << ", " << "statistics="; (__isset.statistics ? (out << to_string(statistics)) : (out << "<null>"));
  out << ")";
}